

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::BlitColorConversionCase::compare
          (BlitColorConversionCase *this,Surface *reference,Surface *result)

{
  ostringstream *this_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  RGBA RVar4;
  TextureFormat format;
  TextureFormat format_00;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  TextureFormat dstFormat;
  TextureFormat srcFormat;
  RGBA local_1dc;
  TextureFormat local_1d8;
  TextureFormat local_1d0;
  BlitColorConversionCase *local_1c8;
  Surface *local_1c0;
  Surface *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  format = glu::mapGLInternalFormat(this->m_srcFormat);
  local_1d0 = format;
  format_00 = glu::mapGLInternalFormat(this->m_dstFormat);
  local_1d8 = format_00;
  bVar2 = tcu::isSRGB(format);
  bVar3 = tcu::isSRGB(format_00);
  if (bVar3) {
    RVar4 = FboTestUtil::getToSRGBConversionThreshold(&local_1d0,&local_1d8);
  }
  else {
    RVar4 = FboTestUtil::getFormatThreshold(&local_1d0);
    uVar9 = (RVar4.m_value & 0xff) << bVar2;
    if (0xfe < uVar9) {
      uVar9 = 0xff;
    }
    uVar6 = (RVar4.m_value >> 8 & 0xff) << bVar2;
    if (0xfe < uVar6) {
      uVar6 = 0xff;
    }
    uVar7 = (RVar4.m_value >> 0x10 & 0xff) << bVar2;
    if (0xfe < uVar7) {
      uVar7 = 0xff;
    }
    uVar8 = (RVar4.m_value >> 0x18) << bVar2;
    if (0xfe < uVar8) {
      uVar8 = 0xff;
    }
    local_1c8 = this;
    local_1c0 = reference;
    local_1b8 = result;
    RVar4 = FboTestUtil::getFormatThreshold(&local_1d8);
    uVar1 = RVar4.m_value & 0xff;
    if ((RVar4.m_value & 0xff) < uVar9) {
      uVar1 = uVar9;
    }
    uVar9 = RVar4.m_value >> 8 & 0xff;
    if (uVar9 < uVar6) {
      uVar9 = uVar6;
    }
    uVar6 = RVar4.m_value >> 0x10 & 0xff;
    if (uVar6 < uVar7) {
      uVar6 = uVar7;
    }
    uVar7 = RVar4.m_value >> 0x18;
    if (RVar4.m_value >> 0x18 < uVar8) {
      uVar7 = uVar8;
    }
    RVar4.m_value = uVar6 << 0x10 | uVar7 << 0x18 | uVar9 << 8 | uVar1;
    this = local_1c8;
    result = local_1b8;
    reference = local_1c0;
  }
  local_1b0._0_8_ =
       ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1dc.m_value = RVar4.m_value;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"threshold = ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
  poVar5 = (ostream *)std::ostream::operator<<(this_00,RVar4.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar4.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar4.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar4.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  bVar2 = tcu::pixelThresholdCompare
                    (((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,"Result","Image comparison result",reference,result,
                     &local_1dc,COMPARE_LOG_RESULT);
  return bVar2;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::TextureFormat	srcFormat	= glu::mapGLInternalFormat(m_srcFormat);
		const tcu::TextureFormat	dstFormat	= glu::mapGLInternalFormat(m_dstFormat);
		const bool					srcIsSRGB	= tcu::isSRGB(srcFormat);
		const bool					dstIsSRGB	= tcu::isSRGB(dstFormat);

		tcu::RGBA					threshold;

		if (dstIsSRGB)
		{
			threshold = getToSRGBConversionThreshold(srcFormat, dstFormat);
		}
		else
		{
			const tcu::RGBA	srcMaxDiff	= getFormatThreshold(srcFormat) * (srcIsSRGB ? 2 : 1);
			const tcu::RGBA	dstMaxDiff	= getFormatThreshold(dstFormat);

			threshold = tcu::max(srcMaxDiff, dstMaxDiff);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "threshold = " << threshold << tcu::TestLog::EndMessage;
		return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, tcu::COMPARE_LOG_RESULT);
	}